

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void rtc::LogMessage::RemoveLogToStream(LogSink *stream)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  CritScope cs;
  CritScope CStack_18;
  
  CritScope::CritScope(&CStack_18,(CriticalSection *)(anonymous_namespace)::g_log_crit);
  puVar3 = &streams__abi_cxx11_;
  do {
    puVar3 = (undefined8 *)*puVar3;
    if ((undefined8 **)puVar3 == &streams__abi_cxx11_) goto LAB_0013ca45;
  } while ((LogSink *)puVar3[2] != stream);
  _DAT_001d1d98 = _DAT_001d1d98 + -1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(puVar3);
LAB_0013ca45:
  puVar3 = streams__abi_cxx11_;
  min_sev_ = dbg_sev_;
  if ((undefined8 **)streams__abi_cxx11_ != &streams__abi_cxx11_) {
    do {
      puVar2 = puVar3;
      puVar3 = (undefined8 *)*puVar2;
    } while ((undefined8 **)puVar3 != &streams__abi_cxx11_);
    iVar1 = *(int *)(puVar2 + 3);
    if (iVar1 < dbg_sev_) {
      min_sev_ = iVar1;
    }
  }
  CritScope::~CritScope(&CStack_18);
  return;
}

Assistant:

void LogMessage::RemoveLogToStream(LogSink* stream) {
  CritScope cs(&g_log_crit);
  for (StreamList::iterator it = streams_.begin(); it != streams_.end(); ++it) {
    if (stream == it->first) {
      streams_.erase(it);
      break;
    }
  }
  UpdateMinLogSeverity();
}